

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

GCtab * lj_tab_new(lua_State *L,uint32_t asize,uint32_t hbits)

{
  undefined4 *puVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  GCtab *pGVar5;
  ulong uVar6;
  long lVar7;
  
  pGVar5 = newtab(L,asize,hbits);
  uVar2 = pGVar5->asize;
  uVar4 = (pGVar5->array).ptr64;
  for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined8 *)(uVar4 + uVar6 * 8) = 0xffffffffffffffff;
  }
  uVar3 = pGVar5->hmask;
  if (uVar3 != 0) {
    uVar4 = (pGVar5->node).ptr64;
    for (lVar7 = 0; (ulong)(uVar3 + 1) * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18) {
      *(undefined8 *)(uVar4 + 0x10 + lVar7) = 0;
      puVar1 = (undefined4 *)(uVar4 + lVar7);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
    }
  }
  return pGVar5;
}

Assistant:

GCtab *lj_tab_new(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t = newtab(L, asize, hbits);
  clearapart(t);
  if (t->hmask > 0) clearhpart(t);
  return t;
}